

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall higan::TcpConnection::DestroyConnection(TcpConnection *this)

{
  LogLevel LVar1;
  undefined8 uVar2;
  Fmt local_328;
  Logger local_228;
  TcpConnection *local_10;
  TcpConnection *this_local;
  
  if ((this->connecting_ & 1U) != 0) {
    this->connecting_ = false;
    local_10 = this;
    Channel::DisableAll(&this->channel_);
    LVar1 = Logger::GetLogLevel();
    if ((int)LVar1 < 2) {
      Logger::Logger(&local_228,INFO,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/TcpConnection.cpp"
                     ,0xbf,"DestroyConnection");
      uVar2 = std::__cxx11::string::c_str();
      Fmt::Fmt(&local_328,"connection: %s closed",uVar2);
      Logger::operator<<(&local_228,&local_328);
      Logger::~Logger(&local_228);
    }
  }
  return;
}

Assistant:

void TcpConnection::DestroyConnection()
{
	if (connecting_)
	{
		connecting_ = false;
		channel_.DisableAll();
		LOG_INFO << higan::Fmt("connection: %s closed", connection_name_.c_str());
	}
}